

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vampire.cpp
# Opt level: O0

Problem * preprocessProblem(Problem *prb)

{
  uint uVar1;
  Mode MVar2;
  Problem *in_RDI;
  Preprocess prepro;
  Options *in_stack_00000028;
  Problem *in_stack_000004d8;
  Preprocess *in_stack_000004e0;
  Preprocess local_18;
  Problem *local_8;
  
  local_8 = in_RDI;
  uVar1 = Shell::Options::randomSeed(Lib::env);
  if (uVar1 == 0) {
    Lib::Random::resetSeed();
  }
  else {
    Shell::Options::randomSeed(Lib::env);
    Lib::Random::setSeed(0);
  }
  MVar2 = Shell::Options::mode(Lib::env);
  if (MVar2 != SPIDER) {
    Kernel::Problem::getProperty((Problem *)Lib::env);
    Shell::Options::checkProblemOptionConstraints
              (in_stack_00000028,(Property *)prb,(bool)prepro._15_1_,(bool)prepro._14_1_);
  }
  Shell::Preprocess::Preprocess(&local_18,Lib::env);
  Shell::Preprocess::preprocess(in_stack_000004e0,in_stack_000004d8);
  return local_8;
}

Assistant:

[[nodiscard]]
Problem* preprocessProblem(Problem* prb)
{
  // Here officially starts preprocessing of vampireMode
  // and that's the moment we want to set the random seed (no randomness in parsing, for the peace of mind)
  // the main reason being that we want to stay in sync with what portfolio mode will do
  // cf ProvingHelper::runVampire
  if (env.options->randomSeed() != 0) {
    Lib::Random::setSeed(env.options->randomSeed());
  } else {
    Lib::Random::resetSeed();
  }

  TIME_TRACE(TimeTrace::PREPROCESSING);

  // this will provide warning if options don't make sense for problem
  if (env.options->mode()!=Options::Mode::SPIDER) {
    env.options->checkProblemOptionConstraints(prb->getProperty(), /*before_preprocessing = */ true);
  }

  Shell::Preprocess prepro(*env.options);
  //phases for preprocessing are being set inside the preprocess method
  prepro.preprocess(*prb);

  return prb;
}